

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void iCopyColors<cCMYK,cBGRA,bModulate>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  EBlend EVar5;
  FSpecialColormap *pFVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  byte *pbVar14;
  
  pFVar6 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_00595142_caseD_0:
    if (count < 1) {
      count = 0;
    }
    pbVar14 = pin + 3;
    for (lVar11 = 0; count != (int)lVar11; lVar11 = lVar11 + 1) {
      pout[lVar11 * 4 + 2] =
           (BYTE)(((uint)pout[lVar11 * 4 + 2] *
                  (uint)(byte)(*pbVar14 - (char)((0x100 - (uint)pbVar14[-3]) * (uint)*pbVar14 >> 8))
                  ) / 0xff);
      pout[lVar11 * 4 + 1] =
           (BYTE)(((uint)pout[lVar11 * 4 + 1] *
                  (uint)(byte)(*pbVar14 - (char)((0x100 - (uint)pbVar14[-2]) * (uint)*pbVar14 >> 8))
                  ) / 0xff);
      pout[lVar11 * 4] =
           (BYTE)(((uint)pout[lVar11 * 4] *
                  (uint)(byte)(*pbVar14 - (char)((0x100 - (uint)pbVar14[-1]) * (uint)*pbVar14 >> 8))
                  ) / 0xff);
      pout[lVar11 * 4 + 3] = 0xff;
      pbVar14 = pbVar14 + step;
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_00595142_caseD_0;
    case BLEND_ICEMAP:
      if (count < 1) {
        count = 0;
      }
      for (lVar11 = 0; count != (int)lVar11; lVar11 = lVar11 + 1) {
        iVar12 = cCMYK::Gray(pin);
        iVar12 = iVar12 >> 4;
        pout[lVar11 * 4 + 2] =
             (BYTE)(((uint)pout[lVar11 * 4 + 2] * (uint)IcePalette[iVar12][0]) / 0xff);
        pout[lVar11 * 4 + 1] =
             (BYTE)(((uint)pout[lVar11 * 4 + 1] * (uint)IcePalette[iVar12][1]) / 0xff);
        pout[lVar11 * 4] = (BYTE)(((uint)pout[lVar11 * 4] * (uint)IcePalette[iVar12][2]) / 0xff);
        pout[lVar11 * 4 + 3] = 0xff;
        pin = pin + step;
      }
      break;
    case BLEND_OVERLAY:
      if (count < 1) {
        count = 0;
      }
      pbVar14 = pin + 3;
      for (lVar11 = 0; count != (int)lVar11; lVar11 = lVar11 + 1) {
        bVar1 = *pbVar14;
        iVar12 = inf->blendcolor[3];
        bVar2 = pbVar14[-2];
        iVar8 = inf->blendcolor[1];
        bVar3 = pbVar14[-1];
        iVar4 = inf->blendcolor[2];
        pout[lVar11 * 4 + 2] =
             (BYTE)(((uint)pout[lVar11 * 4 + 2] *
                    ((uint)(byte)(bVar1 - (char)((0x100 - (uint)pbVar14[-3]) * (uint)bVar1 >> 8)) *
                     iVar12 + inf->blendcolor[0] >> 0x10 & 0xff)) / 0xff);
        pout[lVar11 * 4 + 1] =
             (BYTE)(((uint)pout[lVar11 * 4 + 1] *
                    ((uint)(byte)(bVar1 - (char)((0x100 - (uint)bVar2) * (uint)bVar1 >> 8)) * iVar12
                     + iVar8 >> 0x10 & 0xff)) / 0xff);
        pout[lVar11 * 4] =
             (BYTE)(((uint)pout[lVar11 * 4] *
                    ((uint)(byte)(bVar1 - (char)((0x100 - (uint)bVar3) * (uint)bVar1 >> 8)) * iVar12
                     + iVar4 >> 0x10 & 0xff)) / 0xff);
        pout[lVar11 * 4 + 3] = 0xff;
        pbVar14 = pbVar14 + step;
      }
      break;
    case BLEND_MODULATE:
      if (count < 1) {
        count = 0;
      }
      pbVar14 = pin + 3;
      for (lVar11 = 0; count != (int)lVar11; lVar11 = lVar11 + 1) {
        bVar1 = *pbVar14;
        bVar2 = pbVar14[-2];
        iVar12 = inf->blendcolor[1];
        bVar3 = pbVar14[-1];
        iVar8 = inf->blendcolor[2];
        pout[lVar11 * 4 + 2] =
             (BYTE)(((uint)pout[lVar11 * 4 + 2] *
                    ((uint)(byte)(bVar1 - (char)((0x100 - (uint)pbVar14[-3]) * (uint)bVar1 >> 8)) *
                     inf->blendcolor[0] >> 0x10 & 0xff)) / 0xff);
        pout[lVar11 * 4 + 1] =
             (BYTE)(((uint)pout[lVar11 * 4 + 1] *
                    ((uint)(byte)(bVar1 - (char)((0x100 - (uint)bVar2) * (uint)bVar1 >> 8)) * iVar12
                     >> 0x10 & 0xff)) / 0xff);
        pout[lVar11 * 4] =
             (BYTE)(((uint)pout[lVar11 * 4] *
                    ((uint)(byte)(bVar1 - (char)((0x100 - (uint)bVar3) * (uint)bVar1 >> 8)) * iVar8
                     >> 0x10 & 0xff)) / 0xff);
        pout[lVar11 * 4 + 3] = 0xff;
        pbVar14 = pbVar14 + step;
      }
      break;
    default:
      EVar5 = inf->blend;
      lVar11 = (long)EVar5;
      if (lVar11 < 0x21) {
        if (BLEND_ICEMAP < EVar5) {
          iVar12 = 0x20 - EVar5;
          if (count < 1) {
            count = 0;
          }
          for (lVar11 = 0; count != (int)lVar11; lVar11 = lVar11 + 1) {
            iVar8 = cCMYK::Gray(pin);
            bVar1 = pin[3];
            iVar8 = iVar8 * (EVar5 + BLEND_MODULATE);
            bVar2 = pin[1];
            bVar3 = pin[2];
            pout[lVar11 * 4 + 2] =
                 (BYTE)(((uint)pout[lVar11 * 4 + 2] *
                        ((int)((uint)(byte)(bVar1 - (char)((0x100 - (uint)*pin) * (uint)bVar1 >> 8))
                               * iVar12 + iVar8) / 0x1f & 0xffU)) / 0xff);
            pout[lVar11 * 4 + 1] =
                 (BYTE)(((uint)pout[lVar11 * 4 + 1] *
                        ((int)((uint)(byte)(bVar1 - (char)((0x100 - (uint)bVar2) * (uint)bVar1 >> 8)
                                           ) * iVar12 + iVar8) / 0x1f & 0xffU)) / 0xff);
            pout[lVar11 * 4] =
                 (BYTE)(((uint)pout[lVar11 * 4] *
                        ((int)((uint)(byte)(bVar1 - (char)((0x100 - (uint)bVar3) * (uint)bVar1 >> 8)
                                           ) * iVar12 + iVar8) / 0x1f & 0xffU)) / 0xff);
            pout[lVar11 * 4 + 3] = 0xff;
            pin = pin + step;
          }
        }
      }
      else {
        if (count < 1) {
          count = 0;
        }
        for (lVar13 = 0; count != (int)lVar13; lVar13 = lVar13 + 1) {
          uVar7 = cCMYK::Gray(pin);
          uVar9 = 0xff;
          if (uVar7 < 0xff) {
            uVar9 = uVar7;
          }
          if ((int)uVar7 < 1) {
            uVar9 = 0;
          }
          uVar10 = (ulong)uVar9;
          bVar1 = *(byte *)((long)pFVar6 + uVar10 * 4 + lVar11 * 0x518 + -0xa700);
          bVar2 = *(byte *)((long)pFVar6 + uVar10 * 4 + lVar11 * 0x518 + -0xa6ff);
          pout[lVar13 * 4 + 2] =
               (BYTE)(((uint)pout[lVar13 * 4 + 2] *
                      (uint)*(byte *)((long)pFVar6 + uVar10 * 4 + lVar11 * 0x518 + -0xa6fe)) / 0xff)
          ;
          pout[lVar13 * 4 + 1] = (BYTE)(((uint)pout[lVar13 * 4 + 1] * (uint)bVar2) / 0xff);
          pout[lVar13 * 4] = (BYTE)(((uint)pout[lVar13 * 4] * (uint)bVar1) / 0xff);
          pout[lVar13 * 4 + 3] = 0xff;
          pin = pin + step;
        }
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}